

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O2

void __thiscall
cmOSXBundleGenerator::CreateCFBundle(cmOSXBundleGenerator *this,string *targetName,string *root)

{
  bool bVar1;
  string plist;
  string name;
  string out;
  string local_40;
  
  bVar1 = MustSkip(this);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&out,(string *)root);
    std::__cxx11::string::append((char *)&out);
    cmGeneratorTarget::GetCFBundleDirectory(&plist,this->GT,&this->ConfigName,false);
    std::__cxx11::string::append((string *)&out);
    std::__cxx11::string::~string((string *)&plist);
    cmsys::SystemTools::MakeDirectory(out._M_dataplus._M_p);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&out);
    std::operator+(&name,root,"/");
    cmGeneratorTarget::GetCFBundleDirectory(&local_40,this->GT,&this->ConfigName,true);
    std::operator+(&plist,&name,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::append((char *)&plist);
    cmsys::SystemTools::GetFilenameName(&name,targetName);
    cmLocalGenerator::GenerateAppleInfoPList
              (this->LocalGenerator,this->GT,&name,plist._M_dataplus._M_p);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&plist);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&plist);
    std::__cxx11::string::~string((string *)&out);
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateCFBundle(const std::string& targetName,
                                          const std::string& root)
{
  if (this->MustSkip())
    return;

  // Compute bundle directory names.
  std::string out = root;
  out += "/";
  out += this->GT->GetCFBundleDirectory(this->ConfigName, false);
  cmSystemTools::MakeDirectory(out.c_str());
  this->Makefile->AddCMakeOutputFile(out);

  // Configure the Info.plist file.  Note that it needs the executable name
  // to be set.
  std::string plist = root + "/" +
    this->GT->GetCFBundleDirectory(this->ConfigName, true);
  plist += "/Info.plist";
  std::string name = cmSystemTools::GetFilenameName(targetName);
  this->LocalGenerator->GenerateAppleInfoPList(this->GT,
                                               name,
                                               plist.c_str());
  this->Makefile->AddCMakeOutputFile(plist);
}